

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  pointer pFVar1;
  uint uVar2;
  int iVar3;
  pointer pSVar4;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  Regexp **ppRVar10;
  ulong uVar11;
  long lVar12;
  iterator iter;
  pointer pSVar13;
  int nsuffix;
  int iVar14;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  Regexp *re [2];
  int local_1ec;
  vector<re2::Frame,_std::allocator<re2::Frame>_> local_1e8;
  int local_1c4;
  Regexp **local_1c0;
  undefined1 local_1b8 [392];
  
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c4 = nsub;
  local_1c0 = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&local_1c0,&local_1c4);
  do {
    pFVar1 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar13 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar3 = local_1ec;
    if (pSVar13 == pSVar4) {
LAB_001bba08:
      uVar2 = pFVar1[-1].round;
      pFVar1[-1].round = uVar2 + 1;
      if (uVar2 < 4) {
        splices = &pFVar1[-1].splices;
        switch(uVar2) {
        case 0:
          FactorAlternationImpl::Round1(pFVar1[-1].sub,pFVar1[-1].nsub,0x30f544,splices);
          break;
        case 1:
          FactorAlternationImpl::Round2(pFVar1[-1].sub,pFVar1[-1].nsub,0x30f544,splices);
          break;
        case 2:
          FactorAlternationImpl::Round3(pFVar1[-1].sub,pFVar1[-1].nsub,flags,splices);
          break;
        case 3:
          iVar3 = pFVar1[-1].nsub;
          iVar14 = 1;
          if ((long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                    super__Vector_impl_data._M_start != 0x30) {
            pFVar1 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
            pSVar13 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].splices.
                      super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish = pFVar1;
            if (pSVar13 != (pointer)0x0) {
              operator_delete(pSVar13);
            }
            iVar9 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].spliceidx;
            local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].splices.
            super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9].nsuffix = iVar3;
            local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].spliceidx = iVar9 + 1;
            iVar14 = 3;
            iVar3 = local_1ec;
          }
          goto LAB_001bbaf4;
        }
      }
      else {
        LogMessage::LogMessage
                  ((LogMessage *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                   ,0x3f7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 8),"unknown round: ",0xf);
        std::ostream::operator<<((ostream *)(local_1b8 + 8),pFVar1[-1].round);
        LogMessage::~LogMessage((LogMessage *)local_1b8);
      }
      pSVar13 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar4 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((pSVar13 == pSVar4) || (iVar9 = 0, pFVar1[-1].round == 3)) {
        iVar9 = (int)((ulong)((long)pSVar4 - (long)pSVar13) >> 3) * -0x55555555;
      }
      pFVar1[-1].spliceidx = iVar9;
      iVar14 = 0;
    }
    else {
      iVar9 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].spliceidx;
      iVar14 = (int)((ulong)((long)pSVar4 - (long)pSVar13) >> 3);
      if (SBORROW4(iVar9,iVar14 * -0x55555555) == iVar9 + iVar14 * 0x55555555 < 0) {
        if (local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].nsub < 1) {
          iVar9 = 0;
        }
        else {
          iVar14 = 0;
          uVar11 = 0;
          do {
            ppRVar5 = pFVar1[-1].sub;
            ppRVar10 = ppRVar5 + iVar14;
            if (ppRVar10 < pSVar13->sub) {
              uVar11 = (ulong)(int)uVar11;
              lVar8 = (long)iVar14 << 3;
              do {
                ppRVar5[uVar11] = *ppRVar10;
                uVar11 = uVar11 + 1;
                ppRVar5 = pFVar1[-1].sub;
                ppRVar10 = (Regexp **)((long)ppRVar5 + lVar8 + 8);
                iVar14 = iVar14 + 1;
                lVar8 = lVar8 + 8;
              } while (ppRVar10 < pSVar13->sub);
            }
            iVar9 = (int)uVar11;
            if (pFVar1[-1].round - 1U < 2) {
              local_1b8._0_8_ = pSVar13->prefix;
              local_1b8._8_8_ = AlternateNoFactor(pSVar13->sub,pSVar13->nsuffix,flags);
              pRVar6 = Concat((Regexp **)local_1b8,2,flags);
              pFVar1[-1].sub[iVar9] = pRVar6;
LAB_001bb963:
              uVar11 = (ulong)(iVar9 + 1);
              iVar14 = iVar14 + pSVar13->nsub;
            }
            else {
              if (pFVar1[-1].round == 3) {
                ppRVar5[iVar9] = pSVar13->prefix;
                goto LAB_001bb963;
              }
              LogMessage::LogMessage
                        ((LogMessage *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                         ,0x3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 8),"unknown round: ",0xf);
              std::ostream::operator<<((ostream *)(local_1b8 + 8),pFVar1[-1].round);
              LogMessage::~LogMessage((LogMessage *)local_1b8);
            }
            pSVar13 = pSVar13 + 1;
            if ((pSVar13 ==
                 pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                 _M_impl.super__Vector_impl_data._M_finish) &&
               (iVar9 = pFVar1[-1].nsub, iVar14 < iVar9)) {
              lVar8 = (long)iVar14;
              lVar12 = (long)(int)uVar11;
              iVar7 = 0;
              do {
                ppRVar10 = pFVar1[-1].sub + lVar8;
                lVar8 = lVar8 + 1;
                pFVar1[-1].sub[lVar12] = *ppRVar10;
                lVar12 = lVar12 + 1;
                iVar7 = iVar7 + -1;
              } while (iVar9 != lVar8);
              uVar11 = (ulong)(uint)((int)uVar11 - iVar7);
              iVar14 = iVar14 - iVar7;
            }
            iVar9 = (int)uVar11;
          } while (iVar14 < pFVar1[-1].nsub);
        }
        pSVar13 = pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl
            .super__Vector_impl_data._M_finish != pSVar13) {
          pFVar1[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar13;
        }
        pFVar1[-1].nsub = iVar9;
        goto LAB_001bba08;
      }
      iVar14 = 3;
      std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&pSVar13[iVar9].sub,
                 &pSVar13[iVar9].nsub);
    }
LAB_001bbaf4:
    local_1ec = iVar3;
    if ((iVar14 != 0) && (iVar14 != 3)) {
      std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&local_1e8);
      return local_1ec;
    }
  } while( true );
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}